

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::JsRTCodeParseAction_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  uint64 val;
  int64 iVar1;
  
  if (evt->EventKind == CodeParseActionTag) {
    (*writer->_vptr_FileWriter[3])(writer,0x12,1);
    NSSnapValues::EmitTTDVar(*(TTDVar *)(evt + 1),writer,NoSeparator);
    val._0_4_ = evt[4].EventKind;
    val._4_4_ = evt[4].ResultStatus;
    FileWriter::WriteUInt64(writer,sourceContextId,val,CommaSeparator);
    iVar1 = evt[4].EventTimeStamp;
    (*writer->_vptr_FileWriter[3])(writer,0x4f,1);
    (*writer->_vptr_FileWriter[0x14])(writer,(ulong)(uint)iVar1,0);
    FileWriter::WriteUInt32(writer,bodyCounterId,(uint32)evt[1].EventTimeStamp,CommaSeparator);
    FileWriter::WriteString(writer,uri,(TTString *)(evt + 3),CommaSeparator);
    (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)*(byte *)((long)&evt[1].EventTimeStamp + 4),1)
    ;
    FileWriter::WriteLengthValue(writer,(uint32)evt[2].EventTimeStamp,CommaSeparator);
    JsSupport::WriteCodeToFile
              (threadContext,true,(uint32)evt[1].EventTimeStamp,
               *(bool *)((long)&evt[1].EventTimeStamp + 4),*(byte **)(evt + 2),
               (uint32)evt[2].EventTimeStamp);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTCodeParseAction_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTCodeParseAction* cpAction = GetInlineEventDataAs<JsRTCodeParseAction, EventKind::CodeParseActionTag>(evt);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(cpAction->Result, writer, NSTokens::Separator::NoSeparator);

            writer->WriteUInt64(NSTokens::Key::sourceContextId, cpAction->SourceContextId, NSTokens::Separator::CommaSeparator);
            writer->WriteTag<LoadScriptFlag>(NSTokens::Key::loadFlag, cpAction->LoadFlag, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt32(NSTokens::Key::bodyCounterId, cpAction->BodyCtrId, NSTokens::Separator::CommaSeparator);

            writer->WriteString(NSTokens::Key::uri, cpAction->SourceUri, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, cpAction->IsUtf8, NSTokens::Separator::CommaSeparator);
            writer->WriteLengthValue(cpAction->SourceByteLength, NSTokens::Separator::CommaSeparator);

            JsSupport::WriteCodeToFile(threadContext, true, cpAction->BodyCtrId, cpAction->IsUtf8, cpAction->SourceCode, cpAction->SourceByteLength);
        }